

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_p.h
# Opt level: O2

void __thiscall
QPaintEnginePrivate::setSystemTransformAndViewport
          (QPaintEnginePrivate *this,QTransform *xform,QRegion *region)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  QPaintEnginePrivate *pQVar4;
  QPaintEnginePrivate *pQVar5;
  
  pQVar4 = (QPaintEnginePrivate *)xform;
  pQVar5 = this + 0x40;
  for (lVar3 = 0x4a; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pQVar5 = *pQVar4;
    pQVar4 = pQVar4 + 1;
    pQVar5 = pQVar5 + 1;
  }
  bVar1 = QTransform::isIdentity(xform);
  this[0x98] = (QPaintEnginePrivate)((byte)this[0x98] & 0xfe | !bVar1);
  QRegion::operator=((QRegion *)(this + 0x38),region);
  bVar2 = QRegion::isEmpty();
  this[0x98] = (QPaintEnginePrivate)((byte)this[0x98] & 0xfd | (bVar2 ^ 1) * '\x02');
  updateSystemClip(this);
  if (*(long *)(*(long *)(this + 0x10) + 8) != 0) {
    (**(code **)(*(long *)this + 0x10))(this);
    return;
  }
  return;
}

Assistant:

inline void setSystemTransformAndViewport(const QTransform &xform, const QRegion &region)
    {
        systemTransform = xform;
        hasSystemTransform = !xform.isIdentity();
        systemViewport = region;
        hasSystemViewport = !systemViewport.isEmpty();
        updateSystemClip();
        if (q_ptr->state)
            systemStateChanged();
    }